

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigenconv.h
# Opt level: O0

VectorXf makeEigenVectorFromVectors(vector<float,_std::allocator<float>_> *vecvalues)

{
  value_type vVar1;
  const_reference pvVar2;
  Scalar *pSVar3;
  Index extraout_RDX;
  Index IVar4;
  Index extraout_RDX_00;
  vector<float,_std::allocator<float>_> *in_RSI;
  VectorXf VVar5;
  ulong local_30;
  size_t i;
  size_type local_20;
  size_t n;
  vector<float,_std::allocator<float>_> *vecvalues_local;
  VectorXf *b;
  
  n = (size_t)in_RSI;
  vecvalues_local = vecvalues;
  local_20 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
            ((Matrix<float,__1,_1,_0,__1,_1> *)vecvalues,&local_20);
  IVar4 = extraout_RDX;
  for (local_30 = 0; local_30 < local_20; local_30 = local_30 + 1) {
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)n,local_30);
    vVar1 = *pvVar2;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)vecvalues,
                        local_30);
    *pSVar3 = vVar1;
    IVar4 = extraout_RDX_00;
  }
  VVar5.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar4;
  VVar5.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (float *)vecvalues;
  return (VectorXf)VVar5.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

inline VectorXf makeEigenVectorFromVectors(const vector<float> &vecvalues)
{
    size_t n = vecvalues.size();
    VectorXf b(n);

    for (size_t i = 0; i < n; ++i)
    {
        b(i) = vecvalues[i];
    }

    return b;

}